

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_iterator_move_equalorlarger(roaring64_iterator_t *it,uint64_t val)

{
  _Bool _Var1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  uint16_t low16;
  uint8_t val_high48 [6];
  ushort local_22;
  uint local_20;
  ushort local_1c;
  
  local_20 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_1c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  if ((it->has_value != true) || (uVar3 = it->high48, uVar3 != (val & 0xffffffffffff0000))) {
    _Var1 = art_iterator_lower_bound(&it->art_it,(art_key_chunk_t *)&local_20);
    if (!_Var1) {
      it->has_value = false;
      it->saturated_forward = true;
      return false;
    }
    uVar3 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
    uVar4 = (ulong)*(uint6 *)(it->art_it).key;
    uVar3 = (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
            (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
            uVar4 << 0x38;
    it->high48 = uVar3;
  }
  if (uVar3 == (val & 0xffffffffffff0000)) {
    uVar3 = *(it->art_it).value;
    local_22 = (ushort)it->value;
    _Var1 = container_iterator_lower_bound
                      (it->r->containers[uVar3 >> 8],(uint8_t)uVar3,&it->container_it,&local_22,
                       (uint16_t)val);
    if (_Var1) {
      it->value = (ulong)local_22 | it->high48;
      _Var2 = true;
    }
    else {
      _Var2 = art_iterator_next(&it->art_it);
      if (_Var2) goto LAB_00106333;
      it->saturated_forward = true;
      _Var2 = false;
    }
    it->has_value = _Var2;
  }
  else {
LAB_00106333:
    roaring64_iterator_init_at_leaf_first(it);
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool roaring64_iterator_move_equalorlarger(roaring64_iterator_t *it,
                                           uint64_t val) {
    uint8_t val_high48[ART_KEY_BYTES];
    uint16_t val_low16 = split_key(val, val_high48);
    if (!it->has_value || it->high48 != (val & 0xFFFFFFFFFFFF0000)) {
        // The ART iterator is before or after the high48 bits of `val` (or
        // beyond the ART altogether), so we need to move to a leaf with a
        // key equal or greater.
        if (!art_iterator_lower_bound(&it->art_it, val_high48)) {
            // Only smaller keys found.
            it->saturated_forward = true;
            return (it->has_value = false);
        }
        it->high48 = combine_key(it->art_it.key, 0);
        // Fall through to the next if statement.
    }

    if (it->high48 == (val & 0xFFFFFFFFFFFF0000)) {
        // We're at equal high bits, check if a suitable value can be found
        // in this container.
        leaf_t leaf = (leaf_t)*it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        if (container_iterator_lower_bound(
                get_container(it->r, leaf), get_typecode(leaf),
                &it->container_it, &low16, val_low16)) {
            it->value = it->high48 | low16;
            return (it->has_value = true);
        }
        // Only smaller entries in this container, move to the next.
        if (!art_iterator_next(&it->art_it)) {
            it->saturated_forward = true;
            return (it->has_value = false);
        }
    }

    // We're at a leaf with high bits greater than `val`, so the first entry
    // in this container is our result.
    return roaring64_iterator_init_at_leaf_first(it);
}